

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

void h2o_cache_delete(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  khint_t kVar1;
  uint uVar2;
  kh_cache_t *pkVar3;
  khint32_t *pkVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  khiter_t iter;
  int iVar11;
  
  if (keyhash == 0) {
    keyhash = 0;
    for (sVar7 = key.len; sVar7 != 0; sVar7 = sVar7 - 1) {
      keyhash = (uint)(byte)key.base[sVar7 - 1] + keyhash * 0x1f;
    }
  }
  if ((cache->flags & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cache->mutex);
  }
  purge(cache,now);
  pkVar3 = cache->table;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    iter = 0;
  }
  else {
    uVar9 = keyhash & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar11 = 1;
    uVar10 = uVar9;
    do {
      uVar2 = pkVar4[uVar10 >> 4];
      bVar8 = (char)uVar10 * '\x02' & 0x1e;
      uVar5 = uVar2 >> bVar8;
      if ((uVar5 & 2) != 0) {
LAB_00125e11:
        iter = uVar10;
        if ((uVar2 >> bVar8 & 3) != 0) {
          iter = kVar1;
        }
        break;
      }
      if ((uVar5 & 1) == 0) {
        sVar7 = (pkVar3->keys[uVar10]->key).len;
        if ((sVar7 == key.len) &&
           (iVar6 = bcmp((pkVar3->keys[uVar10]->key).base,key.base,sVar7), iVar6 == 0))
        goto LAB_00125e11;
      }
      uVar10 = uVar10 + iVar11 & kVar1 - 1;
      iVar11 = iVar11 + 1;
      iter = kVar1;
    } while (uVar10 != uVar9);
  }
  if (iter != kVar1) {
    erase_ref(cache,iter,0);
  }
  if ((cache->flags & 1) == 0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cache->mutex);
  return;
}

Assistant:

void h2o_cache_delete(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key;
    khiter_t iter;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) != kh_end(cache->table))
        erase_ref(cache, iter, 0);

    unlock_cache(cache);
}